

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O1

void hts_idx_save(hts_idx_t *idx,char *fn,int fmt)

{
  size_t sVar1;
  char *__dest;
  BGZF *fp;
  FILE *__s;
  int fmt_00;
  uint32_t x [3];
  int local_2c;
  int local_28;
  uint32_t local_24;
  
  sVar1 = strlen(fn);
  __dest = (char *)calloc(1,sVar1 + 5);
  strcpy(__dest,fn);
  if (fmt == 2) {
    sVar1 = strlen(__dest);
    builtin_strncpy(__dest + sVar1,".tbi",5);
    fp = bgzf_open(__dest,"w");
    bgzf_write(fp,"TBI\x01",4);
    fmt_00 = 2;
  }
  else {
    if (fmt == 1) {
      sVar1 = strlen(__dest);
      builtin_strncpy(__dest + sVar1,".bai",5);
      __s = fopen(__dest,"w");
      fwrite("BAI\x01",1,4,__s);
      hts_idx_save_core(idx,__s,1);
      fclose(__s);
      goto LAB_0010ec7a;
    }
    if (fmt != 0) {
      abort();
    }
    sVar1 = strlen(__dest);
    builtin_strncpy(__dest + sVar1,".csi",5);
    fp = bgzf_open(__dest,"w");
    bgzf_write(fp,"CSI\x01",4);
    local_2c = idx->min_shift;
    local_28 = idx->n_lvls;
    local_24 = idx->l_meta;
    bgzf_write(fp,&local_2c,0xc);
    if ((ulong)idx->l_meta != 0) {
      bgzf_write(fp,idx->meta,(ulong)idx->l_meta);
    }
    fmt_00 = 0;
  }
  hts_idx_save_core(idx,fp,fmt_00);
  bgzf_close(fp);
LAB_0010ec7a:
  free(__dest);
  return;
}

Assistant:

void hts_idx_save(const hts_idx_t *idx, const char *fn, int fmt)
{
    char *fnidx;
    fnidx = (char*)calloc(1, strlen(fn) + 5);
    strcpy(fnidx, fn);
    if (fmt == HTS_FMT_CSI) {
        BGZF *fp;
        uint32_t x[3];
        int is_be, i;
        is_be = ed_is_big();
        fp = bgzf_open(strcat(fnidx, ".csi"), "w");
        bgzf_write(fp, "CSI\1", 4);
        x[0] = idx->min_shift; x[1] = idx->n_lvls; x[2] = idx->l_meta;
        if (is_be) {
            for (i = 0; i < 3; ++i)
                bgzf_write(fp, ed_swap_4p(&x[i]), 4);
        } else bgzf_write(fp, &x, 12);
        if (idx->l_meta) bgzf_write(fp, idx->meta, idx->l_meta);
        hts_idx_save_core(idx, fp, HTS_FMT_CSI);
        bgzf_close(fp);
    } else if (fmt == HTS_FMT_TBI) {
        BGZF *fp;
        fp = bgzf_open(strcat(fnidx, ".tbi"), "w");
        bgzf_write(fp, "TBI\1", 4);
        hts_idx_save_core(idx, fp, HTS_FMT_TBI);
        bgzf_close(fp);
    } else if (fmt == HTS_FMT_BAI) {
        FILE *fp;
        fp = fopen(strcat(fnidx, ".bai"), "w");
        fwrite("BAI\1", 1, 4, fp);
        hts_idx_save_core(idx, fp, HTS_FMT_BAI);
        fclose(fp);
    } else abort();
    free(fnidx);
}